

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::Transform(ON_NurbsSurface *this,ON_Xform *xform)

{
  double dVar1;
  bool bVar2;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  ON_Object::TransformUserData((ON_Object *)this,xform);
  bVar2 = true;
  if (this->m_is_rat == 0) {
    dVar1 = xform->m_xform[3][0];
    if ((((dVar1 != 0.0) || (NAN(dVar1))) || (dVar1 = xform->m_xform[3][1], dVar1 != 0.0)) ||
       (((NAN(dVar1) || (dVar1 = xform->m_xform[3][2], dVar1 != 0.0)) || (NAN(dVar1))))) {
      MakeRational(this);
      bVar2 = this->m_is_rat != 0;
    }
    else {
      bVar2 = false;
    }
  }
  bVar2 = ON_TransformPointGrid
                    (this->m_dim,bVar2,this->m_cv_count[0],this->m_cv_count[1],this->m_cv_stride[0],
                     this->m_cv_stride[1],this->m_cv,xform);
  return bVar2;
}

Assistant:

bool ON_NurbsSurface::Transform( const ON_Xform& xform )
{
  DestroySurfaceTree();
  TransformUserData(xform);
  if ( 0 == m_is_rat )
  {
    if ( xform.m_xform[3][0] != 0.0 || xform.m_xform[3][1] != 0.0 || xform.m_xform[3][2] != 0.0 )
    {
      MakeRational();
    }
  }
  return ON_TransformPointGrid( m_dim, m_is_rat?true:false, m_cv_count[0], m_cv_count[1], m_cv_stride[0], m_cv_stride[1], m_cv, xform );
}